

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCppFile.h
# Opt level: O2

void __thiscall cppforth::Forth::fileSize(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  uint handler;
  long lVar1;
  long lVar2;
  allocator<char> local_79;
  shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_> f;
  path local_68;
  string filename;
  
  requireDStackDepth(this,1,"FILE-SIZE");
  this_00 = &this->dStack;
  handler = ForthStack<unsigned_int>::getTop(this_00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"FILE-SIZE",(allocator<char> *)&f);
  GetFileName(&filename,this,handler,&local_68._M_pathname,errorFilePosition);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"FILE-SIZE",&local_79);
  GetFileHandle((Forth *)&f,(Cell)this,(string *)(ulong)handler,(errorCodes)&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::ios::clear((int)f.
                       super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr +
                  (int)*(undefined8 *)
                        (*(long *)f.
                                  super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr + -0x18));
  std::ostream::flush();
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_68,&filename,auto_format);
  lVar1 = std::filesystem::file_size(&local_68);
  std::filesystem::__cxx11::path::~path(&local_68);
  lVar2 = std::istream::tellg();
  if (lVar1 < lVar2) {
    lVar1 = lVar2;
  }
  ForthStack<unsigned_int>::setTop(this_00,0,(uint)lVar1);
  ForthStack<unsigned_int>::push(this_00,(uint)((ulong)lVar1 >> 0x20));
  ForthStack<unsigned_int>::push
            (this_00,-(*(uint *)(f.
                                 super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr +
                                *(long *)(*(long *)f.
                                                  super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr + -0x18) + 0x20) & 1) & 0xffffffbf);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&f.
              super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__cxx11::string::~string((string *)&filename);
  return;
}

Assistant:

void fileSize() {
	REQUIRE_DSTACK_DEPTH(1, "FILE-SIZE");
	auto h = (dStack.getTop());
	auto filename = GetFileName(h, "FILE-SIZE", errorFilePosition);
	auto f = GetFileHandle(h, "FILE-SIZE", errorFilePosition);
	f->clear();
	f->flush();
	auto filesize = std::filesystem::file_size(filename);
	DCell position(filesize);
	DCell currentPosition(f->tellg());
	if (currentPosition.data_.SDcells > position.data_.SDcells) {
		// if OS was not updated filesize of open file, we take biggest value
		position = currentPosition;
	}
	dStack.setTop(0, position.data_.Cells.lo);
	dStack.push(position.data_.Cells.hi);
	dStack.push(f->bad() ? Cell(errorFilePosition) : 0);
}